

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# castchannel.h
# Opt level: O0

bool __thiscall
CastMessage::on_cls(CastMessage *this,uint32_t field_number,void *pdata,size_t sizedata)

{
  size_t sizedata_local;
  void *pdata_local;
  uint32_t field_number_local;
  CastMessage *this_local;
  
  switch(field_number) {
  case 2:
    std::__cxx11::string::assign((char *)&this->_source_id,(ulong)pdata);
    break;
  case 3:
    std::__cxx11::string::assign((char *)&this->_destination_id,(ulong)pdata);
    break;
  case 4:
    std::__cxx11::string::assign((char *)&this->_namespace,(ulong)pdata);
    break;
  default:
    printf("Unknown cls field %u\n",(ulong)field_number);
    return false;
  case 6:
    std::__cxx11::string::assign((char *)&this->_payload_utf8,(ulong)pdata);
    break;
  case 7:
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    assign(&this->_payload_binary,(uchar *)pdata,sizedata);
  }
  return true;
}

Assistant:

bool on_cls(uint32_t field_number, const void* pdata, size_t sizedata) override {
        switch(field_number) {
        case id_source_id:
            _source_id.assign((const char*)pdata, sizedata);
            break;
        case id_destination_id:
            _destination_id.assign((const char*)pdata, sizedata);
            break;
        case id_namespace:
            _namespace.assign((const char*)pdata, sizedata);
            break;
        case id_payload_utf8:
            _payload_utf8.assign((const char*)pdata, sizedata);
            break;
        case id_payload_binary:
            _payload_binary.assign((const unsigned char*)pdata, sizedata);
            break;
        default:
            printf("Unknown cls field %u\n", field_number);
            return false;
        }
        return true;
    }